

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_convolve_2d_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  int iVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 local_8b38 [35592];
  
  uVar6 = (ulong)(uint)w;
  if (-1 < h) {
    puVar3 = local_8b38;
    iVar2 = 0;
    do {
      if (0 < w) {
        uVar7 = 0;
        do {
          *(ushort *)(puVar3 + uVar7 * 2) = (ushort)src[uVar7] + (ushort)src[uVar7 + 1] + 0x100;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      src = src + src_stride;
      puVar3 = puVar3 + (long)w * 2;
      bVar8 = iVar2 != h;
      iVar2 = iVar2 + 1;
    } while (bVar8);
  }
  if (0 < h) {
    puVar5 = local_8b38 + uVar6 * 2;
    lVar1 = (long)w * 2;
    puVar3 = local_8b38;
    iVar2 = 0;
    do {
      if (0 < w) {
        uVar7 = 0;
        do {
          iVar4 = ((int)*(short *)(puVar5 + uVar7 * 2) + (int)*(short *)(puVar3 + uVar7 * 2)) *
                  0x4000 + -0x7f8000 >> 0x10;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          dst[uVar7] = (uint8_t)iVar4;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      dst = dst + dst_stride;
      iVar2 = iVar2 + 1;
      puVar5 = puVar5 + lVar1;
      puVar3 = puVar3 + lVar1;
    } while (iVar2 != h);
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_intrabc_c(const uint8_t *src, int src_stride,
                                  uint8_t *dst, int dst_stride, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_x_qn, const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int bd = 8;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum = (1 << bd) + src[x] + src[x + 1];
      assert(0 <= sum && sum < (1 << (bd + 2)));
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << (bd + 2)) + src_vert[x] + src_vert[im_stride + x];
      assert(0 <= sum && sum < (1 << (bd + 4)));
      const int16_t res =
          ROUND_POWER_OF_TWO(sum, 2) - ((1 << bd) + (1 << (bd - 1)));
      dst[x] = clip_pixel(res);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}